

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Write<double>(Builder *this,double val,size_t byte_width)

{
  size_t byte_width_local;
  double val_local;
  Builder *this_local;
  
  byte_width_local = (size_t)val;
  val_local = (double)this;
  if (byte_width < 9) {
    byte_width_local = (size_t)flatbuffers::EndianScalar<double>(val);
    WriteBytes(this,&byte_width_local,byte_width);
    return;
  }
  __assert_fail("sizeof(T) >= byte_width",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5a3,"void flexbuffers::Builder::Write(T, size_t) [T = double]");
}

Assistant:

void Write(T val, size_t byte_width) {
    FLATBUFFERS_ASSERT(sizeof(T) >= byte_width);
    val = flatbuffers::EndianScalar(val);
    WriteBytes(&val, byte_width);
  }